

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int jx9Builtin_substr_count(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  sxi32 sVar1;
  uint uVar2;
  char *pBlob;
  char *pPattern;
  uint uVar3;
  ulong uVar4;
  char *pcVar5;
  int iValue;
  int nTextlen;
  int nPatlen;
  sxu32 nOfft;
  uint local_48;
  sxu32 local_44;
  jx9_context *local_40;
  sxu32 local_34;
  
  if (1 < nArg) {
    local_40 = pCtx;
    pBlob = jx9_value_to_string(*apArg,(int *)&local_48);
    pPattern = jx9_value_to_string(apArg[1],(int *)&local_44);
    uVar4 = (ulong)(int)local_48;
    pCtx = local_40;
    if (((0 < (long)uVar4) && (0 < (int)local_44)) && ((int)local_44 <= (int)local_48)) {
      if (nArg != 2) {
        uVar2 = jx9_value_to_int(apArg[2]);
        pCtx = local_40;
        if (((int)uVar2 < 0) || (uVar3 = local_48 - uVar2, (int)local_48 < (int)uVar2))
        goto LAB_0012a6c3;
        pBlob = pBlob + uVar2;
        local_48 = uVar3;
        if ((uint)nArg < 4) {
          uVar4 = (ulong)(int)uVar3;
        }
        else {
          uVar2 = jx9_value_to_int(apArg[3]);
          pCtx = local_40;
          if (((int)uVar2 < 0) || ((int)local_48 < (int)uVar2)) goto LAB_0012a6c3;
          uVar4 = (ulong)uVar2;
          local_48 = uVar2;
        }
      }
      pcVar5 = pBlob + uVar4;
      iValue = 0;
      do {
        sVar1 = SyBlobSearch(pBlob,(int)pcVar5 - (int)pBlob,pPattern,local_44,&local_34);
        pCtx = local_40;
        if (sVar1 != 0) break;
        iValue = iValue + 1;
        pBlob = pBlob + (local_34 + local_44);
      } while (pBlob < pcVar5);
      goto LAB_0012a6c5;
    }
  }
LAB_0012a6c3:
  iValue = 0;
LAB_0012a6c5:
  jx9_result_int(pCtx,iValue);
  return 0;
}

Assistant:

static int jx9Builtin_substr_count(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zText, *zPattern, *zEnd;
	int nTextlen, nPatlen;
	int iCount = 0;
	sxu32 nOfft;
	sxi32 rc;
	if( nArg < 2 ){
		/* Missing arguments */
		jx9_result_int(pCtx, 0);
		return JX9_OK;
	}
	/* Point to the haystack */
	zText = jx9_value_to_string(apArg[0], &nTextlen);
	/* Point to the neddle */
	zPattern = jx9_value_to_string(apArg[1], &nPatlen);
	if( nTextlen < 1 || nPatlen < 1 || nPatlen > nTextlen ){
		/* NOOP, return zero */
		jx9_result_int(pCtx, 0);
		return JX9_OK;
	}
	if( nArg > 2 ){
		int nOfft;
		/* Extract the offset */
		nOfft = jx9_value_to_int(apArg[2]);
		if( nOfft < 0 || nOfft > nTextlen ){
			/* Invalid offset, return zero */
			jx9_result_int(pCtx, 0);
			return JX9_OK;
		}
		/* Point to the desired offset */
		zText = &zText[nOfft];
		/* Adjust length */
		nTextlen -= nOfft;
	}
	/* Point to the end of the string */
	zEnd = &zText[nTextlen];
	if( nArg > 3 ){
		int nLen;
		/* Extract the length */
		nLen = jx9_value_to_int(apArg[3]);
		if( nLen < 0 || nLen > nTextlen ){
			/* Invalid length, return 0 */
			jx9_result_int(pCtx, 0);
			return JX9_OK;
		}
		/* Adjust pointer */
		nTextlen = nLen;
		zEnd = &zText[nTextlen];
	}
	/* Perform the search */
	for(;;){
		rc = SyBlobSearch((const void *)zText, (sxu32)(zEnd-zText), (const void *)zPattern, nPatlen, &nOfft);
		if( rc != SXRET_OK ){
			/* Pattern not found, break immediately */
			break;
		}
		/* Increment counter and update the offset */
		iCount++;
		zText += nOfft + nPatlen;
		if( zText >= zEnd ){
			break;
		}
	}
	/* Pattern count */
	jx9_result_int(pCtx, iCount);
	return JX9_OK;
}